

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<register_has_no_reset::MainVisitor,_true,_true,_false,_false>::
visit<slang::ast::CoverpointSymbol>
          (ASTVisitor<register_has_no_reset::MainVisitor,_true,_true,_false,_false> *this,
          CoverpointSymbol *t)

{
  CoverpointSymbol *in_stack_00000018;
  ASTVisitor<register_has_no_reset::MainVisitor,_true,_true,_false,_false> *in_stack_00000020;
  
  visitDefault<slang::ast::CoverpointSymbol>(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }